

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

Variable __thiscall
LiteScript::_Type_CHARACTER::Convert(_Type_CHARACTER *this,Variable *obj,Type *type)

{
  bool bVar1;
  char32_t c;
  Object *pOVar2;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  Variable VVar4;
  String local_40;
  uint *puVar3;
  
  bVar1 = Type::operator==(in_RCX,(Type *)_type_string);
  pOVar2 = Variable::operator->((Variable *)type);
  if (bVar1) {
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    pOVar2 = Variable::operator->((Variable *)type);
    c = Character::operator_cast_to_char32_t((Character *)pOVar2->data);
    String::String(&local_40,c);
    pOVar2 = Variable::operator->((Variable *)this);
    String::operator=((String *)pOVar2->data,&local_40);
    puVar3 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_40.str._M_dataplus._M_p != &local_40.str.field_2) {
      operator_delete(local_40.str._M_dataplus._M_p);
      puVar3 = extraout_RDX_00;
    }
  }
  else {
    VVar4 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    puVar3 = VVar4.nb_ref;
  }
  VVar4.nb_ref = puVar3;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::Convert(const LiteScript::Variable& obj, const LiteScript::Type& type) const {
    if (type == Type::STRING) {
        Variable res = obj->memory.Create(Type::STRING);
        res->GetData<String>() = String(obj->GetData<Character>());
        return res;
    }
    else {
        return obj->memory.Create(Type::NIL);
    }
}